

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *format,char *format_max,float power)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  char *text_end;
  float fVar5;
  char *local_a0;
  float local_94;
  float local_7c;
  float local_74;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  float power_local;
  char *format_max_local;
  char *format_local;
  float v_max_local;
  float v_min_local;
  float v_speed_local;
  float *v_current_max_local;
  float *v_current_min_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    PushID(label);
    BeginGroup();
    fVar5 = CalcItemWidth();
    PushMultiItemsWidths(2,fVar5);
    if (v_min < v_max) {
      local_7c = ImMin<float>(v_max,*v_current_max);
      local_74 = v_min;
    }
    else {
      local_74 = -3.4028235e+38;
      local_7c = *v_current_max;
    }
    bVar2 = DragFloat("##min",v_current_min,v_speed,local_74,local_7c,format,power);
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    if (v_min < v_max) {
      fVar5 = ImMax<float>(v_min,*v_current_min);
      local_94 = v_max;
    }
    else {
      fVar5 = *v_current_min;
      local_94 = 3.4028235e+38;
    }
    local_a0 = format;
    if (format_max != (char *)0x0) {
      local_a0 = format_max;
    }
    bVar3 = DragFloat("##max",v_current_max,v_speed,fVar5,local_94,local_a0,power);
    label_local._7_1_ = bVar2 || bVar3;
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    bool value_changed = DragFloat("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragFloat("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? FLT_MAX : v_max, format_max ? format_max : format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();
    return value_changed;
}